

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

size_t InternalHashToName::SortAndCullByHash(InternalHashToName *a,size_t a_count)

{
  ON__UINT8 *pOVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  wchar_t *pwVar4;
  int iVar5;
  long lVar6;
  InternalHashToName *b;
  InternalHashToName *a_00;
  size_t sVar7;
  bool bVar8;
  
  if (a_count == 0 || a == (InternalHashToName *)0x0) {
    sVar7 = 0;
  }
  else {
    ON_qsort(a,a_count,0x20,CompareHash);
    lVar6 = a_count - 1;
    b = a + 1;
    sVar7 = 1;
    a_00 = a;
    while (bVar8 = lVar6 != 0, lVar6 = lVar6 + -1, bVar8) {
      iVar5 = ON_SHA1_Hash::Compare(&a_00->m_dirty_name_hash,&b->m_dirty_name_hash);
      if (iVar5 != 0) {
        a_00 = a + sVar7;
        uVar2 = *(undefined8 *)(b->m_dirty_name_hash).m_digest;
        uVar3 = *(undefined8 *)((b->m_dirty_name_hash).m_digest + 8);
        pwVar4 = b->m_family_name;
        pOVar1 = a[sVar7].m_dirty_name_hash.m_digest + 0x10;
        *(undefined8 *)pOVar1 = *(undefined8 *)((b->m_dirty_name_hash).m_digest + 0x10);
        *(wchar_t **)(pOVar1 + 8) = pwVar4;
        *(undefined8 *)a[sVar7].m_dirty_name_hash.m_digest = uVar2;
        *(undefined8 *)(a[sVar7].m_dirty_name_hash.m_digest + 8) = uVar3;
        sVar7 = sVar7 + 1;
      }
      b = b + 1;
    }
  }
  return sVar7;
}

Assistant:

static size_t SortAndCullByHash(InternalHashToName* a, size_t a_count)
  {
    if (nullptr == a || a_count <= 0)
      return 0;

    ON_qsort(a, a_count, sizeof(a[0]), InternalHashToName::CompareHash);
    size_t culled_count = 1;
    const InternalHashToName* k1 = &a[0];
    for (size_t i = 1; i < a_count; i++)
    {
      if (0 == InternalHashToName::CompareHash(k1, &a[i]) )
        continue;
      a[culled_count] = a[i];
      k1 = &a[culled_count];
      culled_count++;
    }
    return culled_count;
  }